

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O1

void __thiscall
MenuBar::bindSlot(MenuBar *this,ActionMenu actionMenu,function<void_()> *slot,
                 QMainWindow *mainWindow,QString *text)

{
  undefined8 uVar1;
  QMainWindow *pQVar2;
  undefined4 *puVar3;
  _Base_ptr *pp_Var4;
  pair<std::_Rb_tree_iterator<std::pair<const_ActionMenu,_QAction>_>,_bool> pVar5;
  _Any_data local_88;
  code *local_78;
  undefined8 uStack_70;
  _Any_data local_68;
  code *local_58;
  undefined8 uStack_50;
  QObject local_48 [12];
  ActionMenu actionMenu_local;
  code *local_38;
  undefined8 local_30;
  QMainWindow *mainWindow_local;
  
  actionMenu_local = actionMenu;
  mainWindow_local = mainWindow;
  pVar5 = std::
          _Rb_tree<ActionMenu,std::pair<ActionMenu_const,QAction>,std::_Select1st<std::pair<ActionMenu_const,QAction>>,std::less<ActionMenu>,std::allocator<std::pair<ActionMenu_const,QAction>>>
          ::_M_emplace_unique<ActionMenu&,QMainWindow*&>
                    ((_Rb_tree<ActionMenu,std::pair<ActionMenu_const,QAction>,std::_Select1st<std::pair<ActionMenu_const,QAction>>,std::less<ActionMenu>,std::allocator<std::pair<ActionMenu_const,QAction>>>
                      *)this,&actionMenu_local,&mainWindow_local);
  pp_Var4 = &pVar5.first._M_node._M_node[1]._M_parent;
  QAction::setText((QString *)pp_Var4);
  pQVar2 = mainWindow_local;
  std::function<void_()>::function((function<void_()> *)&local_68,slot);
  local_38 = QAction::triggered;
  local_30 = 0;
  puVar3 = (undefined4 *)operator_new(0x30);
  uVar1 = uStack_50;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (code *)0x0;
  uStack_70 = uStack_50;
  if (local_58 != (code *)0x0) {
    local_88._M_unused._M_object = local_68._M_unused._M_object;
    local_88._8_8_ = local_68._8_8_;
    local_78 = local_58;
    local_58 = (code *)0x0;
    uStack_50 = 0;
  }
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::QFunctorSlotObject<std::function<void_()>,_0,_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar3 + 4) = 0;
  *(undefined8 *)(puVar3 + 6) = 0;
  *(undefined8 *)(puVar3 + 8) = 0;
  *(undefined8 *)(puVar3 + 10) = uVar1;
  if (local_78 != (code *)0x0) {
    *(void **)(puVar3 + 4) = local_88._M_unused._M_object;
    *(undefined8 *)(puVar3 + 6) = local_88._8_8_;
    *(code **)(puVar3 + 8) = local_78;
    local_78 = (code *)0x0;
    uStack_70 = 0;
  }
  QObject::connectImpl
            (local_48,pp_Var4,(QObject *)&local_38,(void **)pQVar2,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  QMetaObject::Connection::~Connection((Connection *)local_48);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  return;
}

Assistant:

void MenuBar::bindSlot( ActionMenu actionMenu, std::function<void( void )> slot, QMainWindow* mainWindow, const QString& text )
{
    auto [it, _] = mapAction.emplace( actionMenu, mainWindow );
    it->second.setText( text );
    QObject::connect( &it->second, &QAction::triggered, mainWindow, slot );
}